

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  size_t id;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  db;
  Server svr;
  undefined8 local_380;
  _Any_data local_378;
  code *local_368;
  code *local_360;
  _Any_data local_358;
  code *local_348;
  code *local_340;
  _Any_data local_338;
  code *local_328;
  code *local_320;
  _Any_data local_318;
  code *local_308;
  code *local_300;
  _Any_data local_2f8;
  code *local_2e8;
  code *local_2e0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d8;
  Server local_2a8;
  
  httplib::Server::Server(&local_2a8);
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2d8._M_impl.super__Rb_tree_header._M_header;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_380 = 0;
  local_378._M_unused._M_object = (void *)0x0;
  local_378._8_8_ = 0;
  local_360 = std::
              _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:36:15)>
              ::_M_invoke;
  local_368 = std::
              _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:36:15)>
              ::_M_manager;
  local_2d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2d8._M_impl.super__Rb_tree_header._M_header._M_left;
  httplib::Server::Get(&local_2a8,"/",(Handler *)&local_378);
  std::_Function_base::~_Function_base((_Function_base *)&local_378);
  local_2f8._8_8_ = 0;
  local_2e0 = std::
              _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:41:27)>
              ::_M_invoke;
  local_2e8 = std::
              _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:41:27)>
              ::_M_manager;
  local_2f8._M_unused._M_object = &local_2d8;
  httplib::Server::Get(&local_2a8,"/msg/(\\d+)",(Handler *)&local_2f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_2f8);
  local_318._8_8_ = &local_380;
  local_300 = std::
              _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:61:16)>
              ::_M_invoke;
  local_308 = std::
              _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:61:16)>
              ::_M_manager;
  local_318._M_unused._M_object = &local_2d8;
  httplib::Server::Post(&local_2a8,"/",(Handler *)&local_318);
  std::_Function_base::~_Function_base((_Function_base *)&local_318);
  local_338._8_8_ = 0;
  local_320 = std::
              _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:83:17)>
              ::_M_invoke;
  local_328 = std::
              _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:83:17)>
              ::_M_manager;
  local_338._M_unused._M_object = &local_2d8;
  httplib::Server::Patch(&local_2a8,"/",(Handler *)&local_338);
  std::_Function_base::~_Function_base((_Function_base *)&local_338);
  local_358._8_8_ = 0;
  local_340 = std::
              _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:103:30)>
              ::_M_invoke;
  local_348 = std::
              _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alexgb0[P]restapi-cpp-httplib-example/rest-api-httplib/main.cpp:103:30)>
              ::_M_manager;
  local_358._M_unused._M_object = &local_2d8;
  httplib::Server::Delete(&local_2a8,"/msg/(\\d+)",(Handler *)&local_358);
  std::_Function_base::~_Function_base((_Function_base *)&local_358);
  httplib::Server::listen(&local_2a8,0x12d91b,0x1f90);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_2d8);
  httplib::Server::~Server(&local_2a8);
  return 0;
}

Assistant:

int main(void)
{
	httplib::Server svr;

	std::map<size_t, std::string> db;
	size_t id = 0;

	svr.Get("/", [](const httplib::Request&, httplib::Response& res)
		{
			res.set_content("Hello World!", "text/plain");
		});

	svr.Get(R"(/msg/(\d+))", [&](const httplib::Request& req, httplib::Response& res)
		{
			auto n = req.matches[1];

			nlohmann::json jRes;

			try
			{
				jRes["id"] = std::stoi(n);
				jRes["msg"] = db[std::stoi(n)];

				res.set_content(jRes.dump(), "application/json");
			}
			catch (const std::exception&)
			{
				res.set_content("Cannot find the requested message.", "text/plain");
			}

		});

	svr.Post("/", [&](const httplib::Request& req, httplib::Response& res)
		{
			nlohmann::json json = nlohmann::json::parse(req.body);

			if (bValidReq(json, { "msg" }))
			{
				db.insert({ id, json["msg"] });

				nlohmann::json jRes;

				jRes["id"] = id;
				jRes["msg"] = db[id];

				id++;

				res.set_content(jRes.dump(), "application/json");
			}
			else
				res.set_content("The request doesn't meet the requirements", "text/plain");

		});

	svr.Patch("/", [&](const httplib::Request& req, httplib::Response& res)
		{
			nlohmann::json json = nlohmann::json::parse(req.body);

			if (bValidReq(json, { "id", "msg" }))
			{
				db[json["id"]] = json["msg"];

				nlohmann::json jRes;

				jRes["id"] = json["id"];
				jRes["msg"] = db[json["id"]];

				res.set_content(jRes.dump(), "application/json");
			}
			else
				res.set_content("The request doesn't meet the requirements", "text/plain");

		});

	svr.Delete(R"(/msg/(\d+))", [&](const httplib::Request& req, httplib::Response& res)
		{

			auto n = req.matches[1];

			db[std::stoi(n)] = "deleted";

			nlohmann::json jRes;

			jRes["id"] = std::stoi(n);
			jRes["msg"] = "deleted";

			res.set_content(jRes.dump(), "application/json");

		});


	svr.listen("0.0.0.0", 8080);
	return 0;
}